

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_pass.h
# Opt level: O1

void __thiscall mocker::SSADestruction::SSADestruction(SSADestruction *this,FunctionModule *func)

{
  (this->super_FuncPass).func = func;
  (this->super_FuncPass).super_OptPass._vptr_OptPass = (_func_int **)&PTR__SSADestruction_001f26f0;
  (this->parallelCopies)._M_h._M_buckets = &(this->parallelCopies)._M_h._M_single_bucket;
  (this->parallelCopies)._M_h._M_bucket_count = 1;
  (this->parallelCopies)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->parallelCopies)._M_h._M_element_count = 0;
  (this->parallelCopies)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->parallelCopies)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->parallelCopies)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->addresses)._M_h._M_buckets = &(this->addresses)._M_h._M_single_bucket;
  (this->addresses)._M_h._M_bucket_count = 1;
  (this->addresses)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->addresses)._M_h._M_element_count = 0;
  (this->addresses)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->addresses)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->addresses)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

explicit FuncPass(ir::FunctionModule &func) : func(func) {}